

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::IfStmt::add_then_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  StmtException *this_00;
  initializer_list<kratos::IRNode_*> __l;
  IfStmt *local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_60;
  string local_48;
  allocator_type local_21;
  
  if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ != Block)
  {
    StmtBlock::add_stmt(&((this->then_body_).
                          super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_StmtBlock,stmt);
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"cannot add statement block to the if statement body","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  local_68 = this;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_60,__l,&local_21);
  StmtException::StmtException(this_00,&local_48,&local_60);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IfStmt::add_then_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (stmt->type() == StatementType::Block)
        throw StmtException("cannot add statement block to the if statement body", {this});
    then_body_->add_stmt(stmt);
}